

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

void __thiscall
slang::ast::UniquenessConstraint::serializeTo(UniquenessConstraint *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppEVar2;
  long lVar3;
  string_view name;
  
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->items)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->items)._M_ptr;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void UniquenessConstraint::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("items");
    for (auto item : items)
        serializer.serialize(*item);
    serializer.endArray();
}